

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

sat_solver *
Sbd_ManSatSolver(sat_solver *pSat,Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fQbf)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int *begin;
  int *end;
  bool local_13d;
  bool local_135;
  bool local_12d;
  bool local_125;
  int local_124;
  int local_120;
  int local_118;
  int local_110;
  int local_10c;
  int local_108;
  bool local_e1;
  bool local_d9;
  int local_d8;
  int local_d4;
  int local_9c;
  int local_98;
  int pLits [2];
  int n;
  Vec_Int_t *vFaninVars;
  int nVars;
  int LastVar;
  int PivotVar;
  int TfoStart;
  int RetValue;
  int fCompl1;
  int fCompl0;
  int Node;
  int Lit1m;
  int Lit0m;
  int Fan1;
  int Fan0;
  int iObj;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObj2Var_local;
  Vec_Int_t *vWinObjs_local;
  Vec_Int_t *pVStack_28;
  int Pivot_local;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  sat_solver *pSat_local;
  
  Fan0 = 1;
  pObj = (Gia_Obj_t *)vObj2Var;
  vObj2Var_local = vWinObjs;
  vWinObjs_local._4_4_ = Pivot;
  pVStack_28 = vMirrors;
  vMirrors_local = (Vec_Int_t *)p;
  p_local = (Gia_Man_t *)pSat;
  iVar3 = Vec_IntSize(vWinObjs);
  iVar4 = Vec_IntSize(vTfo);
  iVar3 = iVar3 - iVar4;
  iVar4 = Vec_IntEntry((Vec_Int_t *)pObj,vWinObjs_local._4_4_);
  iVar5 = Vec_IntSize(vObj2Var_local);
  iVar6 = Vec_IntSize(vTfo);
  iVar7 = Vec_IntSize(vRoots);
  iVar7 = iVar5 + iVar6 + iVar7;
  if (p_local == (Gia_Man_t *)0x0) {
    p_local = (Gia_Man_t *)sat_solver_new();
  }
  else {
    sat_solver_restart((sat_solver *)p_local);
  }
  pGVar2 = p_local;
  iVar5 = Vec_IntSize(vObj2Var_local);
  iVar6 = Vec_IntSize(vTfo);
  iVar8 = Vec_IntSize(vRoots);
  sat_solver_setnvars((sat_solver *)pGVar2,iVar5 + iVar6 + iVar8 + 100);
  sat_solver_addclause((sat_solver *)p_local,&Fan0,&iObj);
  for (iObj = 1; iVar5 = iObj, iVar8 = Vec_IntSize(vObj2Var_local), iVar6 = iVar3, iVar5 < iVar8;
      iObj = iObj + 1) {
    iVar5 = Vec_IntEntry(vObj2Var_local,iObj);
    _iLit = Gia_ManObj((Gia_Man_t *)vMirrors_local,iVar5);
    iVar6 = Gia_ObjIsCi(_iLit);
    if (iVar6 == 0) {
      iVar6 = Gia_ObjIsAnd(_iLit);
      if (iVar6 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,0x4e,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar6 = Vec_IntEntry(pVStack_28,iVar5);
      if (-1 < iVar6) {
        __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,0x4f,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar6 = Vec_IntEntry((Vec_Int_t *)pObj,iVar5);
      pVVar1 = pVStack_28;
      iVar8 = Gia_ObjFaninId0(_iLit,iVar5);
      iVar8 = Vec_IntEntry(pVVar1,iVar8);
      pVVar1 = pVStack_28;
      iVar9 = Gia_ObjFaninId1(_iLit,iVar5);
      iVar9 = Vec_IntEntry(pVVar1,iVar9);
      if (iVar8 < 0) {
        local_d4 = Gia_ObjFaninId0(_iLit,iVar5);
      }
      else {
        local_d4 = Abc_Lit2Var(iVar8);
      }
      if (iVar9 < 0) {
        local_d8 = Gia_ObjFaninId1(_iLit,iVar5);
      }
      else {
        local_d8 = Abc_Lit2Var(iVar9);
      }
      iVar5 = Vec_IntEntry((Vec_Int_t *)pObj,local_d4);
      iVar10 = Vec_IntEntry((Vec_Int_t *)pObj,local_d8);
      uVar11 = Gia_ObjFaninC0(_iLit);
      local_d9 = false;
      if (-1 < iVar8) {
        iVar8 = Abc_LitIsCompl(iVar8);
        local_d9 = iVar8 != 0;
      }
      uVar12 = Gia_ObjFaninC1(_iLit);
      local_e1 = false;
      if (-1 < iVar9) {
        iVar8 = Abc_LitIsCompl(iVar9);
        local_e1 = iVar8 != 0;
      }
      iVar8 = Gia_ObjIsXor(_iLit);
      if (iVar8 == 0) {
        sat_solver_add_and((sat_solver *)p_local,iVar6,iVar5,iVar10,uVar11 ^ local_d9,
                           uVar12 ^ local_e1,0);
      }
      else {
        sat_solver_add_xor((sat_solver *)p_local,iVar6,iVar5,iVar10,
                           uVar11 ^ local_d9 ^ uVar12 ^ local_e1);
      }
    }
  }
  while (iObj = iVar6, iVar5 = iObj, iVar6 = Vec_IntSize(vObj2Var_local), iVar5 < iVar6) {
    iVar5 = Vec_IntEntry(vObj2Var_local,iObj);
    _iLit = Gia_ManObj((Gia_Man_t *)vMirrors_local,iVar5);
    iVar6 = Gia_ObjIsAnd(_iLit);
    if (iVar6 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0x62,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar6 = Vec_IntEntry(pVStack_28,iVar5);
    if (-1 < iVar6) {
      __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,99,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    iVar6 = Vec_IntEntry((Vec_Int_t *)pObj,iVar5);
    iVar8 = Vec_IntSize(vTfo);
    pVVar1 = pVStack_28;
    iVar9 = Gia_ObjFaninId0(_iLit,iVar5);
    iVar9 = Vec_IntEntry(pVVar1,iVar9);
    pVVar1 = pVStack_28;
    iVar10 = Gia_ObjFaninId1(_iLit,iVar5);
    iVar10 = Vec_IntEntry(pVVar1,iVar10);
    if (iVar9 < 0) {
      local_108 = Gia_ObjFaninId0(_iLit,iVar5);
    }
    else {
      local_108 = Abc_Lit2Var(iVar9);
    }
    if (iVar10 < 0) {
      local_10c = Gia_ObjFaninId1(_iLit,iVar5);
    }
    else {
      local_10c = Abc_Lit2Var(iVar10);
    }
    local_110 = Vec_IntEntry((Vec_Int_t *)pObj,local_108);
    local_118 = Vec_IntEntry((Vec_Int_t *)pObj,local_10c);
    if (iVar3 <= local_110) {
      iVar5 = Vec_IntSize(vTfo);
      local_110 = local_110 + iVar5;
    }
    Lit0m = local_110;
    if (iVar3 <= local_118) {
      iVar5 = Vec_IntSize(vTfo);
      local_118 = local_118 + iVar5;
    }
    Lit1m = local_118;
    if (fQbf != 0) {
      local_120 = iVar7;
      if (local_110 != iVar4) {
        local_120 = local_110;
      }
      Lit0m = local_120;
      local_124 = iVar7;
      if (local_118 != iVar4) {
        local_124 = local_118;
      }
      Lit1m = local_124;
    }
    uVar11 = Gia_ObjFaninC0(_iLit);
    local_125 = fQbf == 0 && Lit0m == iVar4;
    local_12d = false;
    if (-1 < iVar9) {
      iVar5 = Abc_LitIsCompl(iVar9);
      local_12d = iVar5 != 0;
    }
    uVar11 = uVar11 ^ local_125 ^ (uint)local_12d;
    uVar12 = Gia_ObjFaninC1(_iLit);
    local_135 = fQbf == 0 && Lit1m == iVar4;
    local_13d = false;
    if (-1 < iVar10) {
      iVar5 = Abc_LitIsCompl(iVar10);
      local_13d = iVar5 != 0;
    }
    uVar12 = uVar12 ^ local_135 ^ (uint)local_13d;
    iVar5 = Gia_ObjIsXor(_iLit);
    if (iVar5 == 0) {
      sat_solver_add_and((sat_solver *)p_local,iVar6 + iVar8,Lit0m,Lit1m,uVar11,uVar12,0);
    }
    else {
      sat_solver_add_xor((sat_solver *)p_local,iVar6 + iVar8,Lit0m,Lit1m,uVar11 ^ uVar12);
    }
    iVar6 = iObj + 1;
  }
  iVar3 = Vec_IntSize(vRoots);
  if (iVar3 < 1) {
    if (fQbf != 0) {
      for (pLits[0] = 0; pLits[0] < 2; pLits[0] = pLits[0] + 1) {
        local_9c = Abc_Var2Lit(iVar4,pLits[0]);
        local_98 = Abc_Var2Lit(iVar7,pLits[0]);
        iVar3 = sat_solver_addclause((sat_solver *)p_local,&local_9c,pLits);
        if (iVar3 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                        ,0x97,
                        "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
      }
    }
  }
  else {
    iVar4 = Vec_IntSize(vObj2Var_local);
    iVar3 = Vec_IntSize(vTfo);
    iVar5 = Vec_IntSize(vRoots);
    register0x00000000 = Vec_IntAlloc(iVar5);
    vFaninVars._4_4_ = iVar4 + iVar3;
    for (iObj = 0; iVar4 = iObj, iVar3 = Vec_IntSize(vRoots), pGVar2 = p_local, iVar4 < iVar3;
        iObj = iObj + 1) {
      iVar4 = Vec_IntEntry(vRoots,iObj);
      iVar3 = Vec_IntEntry(pVStack_28,iVar4);
      if (-1 < iVar3) {
        __assert_fail("Vec_IntEntry( vMirrors, iObj ) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                      ,0x80,
                      "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar4 = Vec_IntEntry((Vec_Int_t *)pObj,iVar4);
      pVVar1 = stack0xffffffffffffff70;
      iVar3 = Abc_Var2Lit(vFaninVars._4_4_,0);
      Vec_IntPush(pVVar1,iVar3);
      pGVar2 = p_local;
      iVar3 = Vec_IntSize(vTfo);
      sat_solver_add_xor((sat_solver *)pGVar2,iVar4,iVar4 + iVar3,vFaninVars._4_4_,0);
      vFaninVars._4_4_ = vFaninVars._4_4_ + 1;
    }
    begin = Vec_IntArray(stack0xffffffffffffff70);
    end = Vec_IntLimit(stack0xffffffffffffff70);
    iVar4 = sat_solver_addclause((sat_solver *)pGVar2,begin,end);
    Vec_IntFree(stack0xffffffffffffff70);
    if (iVar4 == 0) {
      sat_solver_delete((sat_solver *)p_local);
      return (sat_solver *)0x0;
    }
    iVar4 = sat_solver_nvars((sat_solver *)p_local);
    if (iVar4 != vFaninVars._4_4_ + 100) {
      __assert_fail("sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                    ,0x8d,
                    "sat_solver *Sbd_ManSatSolver(sat_solver *, Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
  }
  iVar4 = sat_solver_simplify((sat_solver *)p_local);
  if (iVar4 == 0) {
    sat_solver_delete((sat_solver *)p_local);
    pSat_local = (sat_solver *)0x0;
  }
  else {
    pSat_local = (sat_solver *)p_local;
  }
  return pSat_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Constructs SAT solver for the window.]

  Description [The window for the pivot node (Pivot) is represented as
  a DFS ordered array of objects (vWinObjs) whose indexed in the array
  (which will be used as SAT variables) are given in array vObj2Var.
  The TFO nodes are listed as the last ones in vWinObjs. The root nodes
  are labeled with Abc_LitIsCompl() in vTfo and also given in vRoots.
  If fQbf is 1, returns the instance meant for QBF solving. It is using
  the last variable (LastVar) as the placeholder for the second copy
  of the pivot node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, 
                               int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                               Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf )
{
    Gia_Obj_t * pObj;
    int i, iLit = 1, iObj, Fan0, Fan1, Lit0m, Lit1m, Node, fCompl0, fCompl1, RetValue;
    int TfoStart = Vec_IntSize(vWinObjs) - Vec_IntSize(vTfo);
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int LastVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    //Vec_IntPrint( vWinObjs );
    //Vec_IntPrint( vTfo );
    //Vec_IntPrint( vRoots );
    // create SAT solver
    if ( pSat == NULL )
        pSat = sat_solver_new();
    else
        sat_solver_restart( pSat );
    sat_solver_setnvars( pSat, Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots) + SBD_FVAR_MAX );
    // create constant 0 clause
    sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    // add clauses for all nodes
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, 1 )
    {
        pObj = Gia_ManObj( p, iObj );
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj );
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    // add second clauses for the TFO
    Vec_IntForEachEntryStart( vWinObjs, iObj, i, TfoStart )
    {
        pObj = Gia_ManObj( p, iObj );
        assert( Gia_ObjIsAnd(pObj) );
        assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
        Node = Vec_IntEntry( vObj2Var, iObj ) + Vec_IntSize(vTfo);
        Lit0m = Vec_IntEntry( vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        Lit1m = Vec_IntEntry( vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Fan0 = Vec_IntEntry( vObj2Var, Fan0 );
        Fan1 = Vec_IntEntry( vObj2Var, Fan1 );
        Fan0 = Fan0 < TfoStart ? Fan0 : Fan0 + Vec_IntSize(vTfo);
        Fan1 = Fan1 < TfoStart ? Fan1 : Fan1 + Vec_IntSize(vTfo);
        if ( fQbf )
        {
            Fan0 = Fan0 == PivotVar ? LastVar : Fan0;
            Fan1 = Fan1 == PivotVar ? LastVar : Fan1;
        }
        fCompl0 = Gia_ObjFaninC0(pObj) ^ (!fQbf && Fan0 == PivotVar) ^ (Lit0m >= 0 && Abc_LitIsCompl(Lit0m));
        fCompl1 = Gia_ObjFaninC1(pObj) ^ (!fQbf && Fan1 == PivotVar) ^ (Lit1m >= 0 && Abc_LitIsCompl(Lit1m));
        if ( Gia_ObjIsXor(pObj) )
            sat_solver_add_xor( pSat, Node, Fan0, Fan1, fCompl0 ^ fCompl1 );
        else
            sat_solver_add_and( pSat, Node, Fan0, Fan1, fCompl0, fCompl1, 0 );
    }
    if ( Vec_IntSize(vRoots) > 0 )
    {
        // create XOR clauses for the roots
        int nVars = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo);
        Vec_Int_t * vFaninVars = Vec_IntAlloc( Vec_IntSize(vRoots) );
        Vec_IntForEachEntry( vRoots, iObj, i )
        {
            assert( Vec_IntEntry( vMirrors, iObj ) < 0 );
            Node = Vec_IntEntry( vObj2Var, iObj );
            Vec_IntPush( vFaninVars, Abc_Var2Lit(nVars, 0) );
            sat_solver_add_xor( pSat, Node, Node + Vec_IntSize(vTfo), nVars++, 0 );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vFaninVars), Vec_IntLimit(vFaninVars) );
        Vec_IntFree( vFaninVars );
        if ( RetValue == 0 )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
        assert( sat_solver_nvars(pSat) == nVars + SBD_FVAR_MAX );
    }
    else if ( fQbf )
    {
        int n, pLits[2];
        for ( n = 0; n < 2; n++ )
        {
            pLits[0] = Abc_Var2Lit( PivotVar, n );
            pLits[1] = Abc_Var2Lit( LastVar, n );
            RetValue = sat_solver_addclause( pSat, pLits, pLits + 2 );
            assert( RetValue );
        }
    }
    // finalize
    RetValue = sat_solver_simplify( pSat );
    if ( RetValue == 0 )
    {
        sat_solver_delete( pSat );
        return NULL;    
    }
    return pSat;
}